

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseResidency.cpp
# Opt level: O2

TestCaseGroup * vkt::sparse::createImageSparseResidencyTests(TestContext *testCtx)

{
  ImageType IVar1;
  int iVar2;
  TestCaseGroup *pTVar3;
  ostream *poVar4;
  TestNode *node;
  long lVar5;
  ImageType imageType;
  TextureFormat *format;
  long lVar6;
  long lVar7;
  allocator<char> local_261;
  TestContext *local_260;
  UVec3 imageSize;
  ImageParameters *local_248;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTypeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  string local_1e8;
  string local_1c8;
  ostringstream stream;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  local_260 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,testCtx,"image_sparse_residency","Buffer Sparse Residency");
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar3;
  if (createImageSparseResidencyTests(tcu::TestContext&)::imageParametersArray == '\0') {
    iVar2 = __cxa_guard_acquire(&createImageSparseResidencyTests(tcu::TestContext&)::
                                 imageParametersArray);
    if (iVar2 != 0) {
      createImageSparseResidencyTests::imageParametersArray[0].imageType = IMAGE_TYPE_2D;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[0].m_data[0] = 0x200;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[0].m_data[1] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[0].m_data[2] = 1;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[1].m_data[0] = 0x400;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[1].m_data[1] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[1].m_data[2] = 1;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[2].m_data[0] = 0xb;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[2].m_data[1] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[0].imageSizes[2].m_data[2] = 1;
      createImageSparseResidencyTests::imageParametersArray[1].imageType = IMAGE_TYPE_2D_ARRAY;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[0].m_data[0] = 0x200;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[0].m_data[1] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[0].m_data[2] = 6;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[1].m_data[0] = 0x400;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[1].m_data[1] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[1].m_data[2] = 8;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[2].m_data[0] = 0xb;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[2].m_data[1] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[1].imageSizes[2].m_data[2] = 3;
      createImageSparseResidencyTests::imageParametersArray[2].imageType = IMAGE_TYPE_CUBE;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[0].m_data[0] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[0].m_data[1] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[0].m_data[2] = 1;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[1].m_data[0] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[1].m_data[1] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[1].m_data[2] = 1;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[2].m_data[0] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[2].m_data[1] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[2].imageSizes[2].m_data[2] = 1;
      createImageSparseResidencyTests::imageParametersArray[3].imageType = IMAGE_TYPE_CUBE_ARRAY;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[0].m_data[0] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[0].m_data[1] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[0].m_data[2] = 6;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[1].m_data[0] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[1].m_data[1] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[1].m_data[2] = 8;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[2].m_data[0] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[2].m_data[1] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[3].imageSizes[2].m_data[2] = 3;
      createImageSparseResidencyTests::imageParametersArray[4].imageType = IMAGE_TYPE_3D;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[0].m_data[0] = 0x200;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[0].m_data[1] = 0x100;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[0].m_data[2] = 0x10;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[1].m_data[0] = 0x400;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[1].m_data[1] = 0x80;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[1].m_data[2] = 8;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[2].m_data[0] = 0xb;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[2].m_data[1] = 0x89;
      createImageSparseResidencyTests::imageParametersArray[4].imageSizes[2].m_data[2] = 3;
      __cxa_guard_release(&createImageSparseResidencyTests(tcu::TestContext&)::imageParametersArray)
      ;
    }
  }
  if (createImageSparseResidencyTests(tcu::TestContext&)::formats == '\0') {
    iVar2 = __cxa_guard_acquire(&createImageSparseResidencyTests(tcu::TestContext&)::formats);
    if (iVar2 != 0) {
      createImageSparseResidencyTests::formats[0].order = R;
      createImageSparseResidencyTests::formats[0].type = SIGNED_INT32;
      createImageSparseResidencyTests::formats[1].order = R;
      createImageSparseResidencyTests::formats[1].type = SIGNED_INT16;
      createImageSparseResidencyTests::formats[2].order = R;
      createImageSparseResidencyTests::formats[2].type = SIGNED_INT8;
      createImageSparseResidencyTests::formats[3].order = RG;
      createImageSparseResidencyTests::formats[3].type = SIGNED_INT32;
      createImageSparseResidencyTests::formats[4].order = RG;
      createImageSparseResidencyTests::formats[4].type = SIGNED_INT16;
      createImageSparseResidencyTests::formats[5].order = RG;
      createImageSparseResidencyTests::formats[5].type = SIGNED_INT8;
      createImageSparseResidencyTests::formats[6].order = RGBA;
      createImageSparseResidencyTests::formats[6].type = UNSIGNED_INT32;
      createImageSparseResidencyTests::formats[7].order = RGBA;
      createImageSparseResidencyTests::formats[7].type = UNSIGNED_INT16;
      createImageSparseResidencyTests::formats[8].order = RGBA;
      createImageSparseResidencyTests::formats[8].type = UNSIGNED_INT8;
      __cxa_guard_release(&createImageSparseResidencyTests(tcu::TestContext&)::formats);
    }
  }
  local_248 = createImageSparseResidencyTests::imageParametersArray;
  for (lVar5 = 0;
      pTVar3 = testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar5 != 5; lVar5 = lVar5 + 1) {
    IVar1 = createImageSparseResidencyTests::imageParametersArray[lVar5].imageType;
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    getImageTypeName_abi_cxx11_((string *)&stream,(sparse *)(ulong)IVar1,imageType);
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,local_260,_stream,"");
    imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar3;
    std::__cxx11::string::~string((string *)&stream);
    for (lVar6 = 0;
        pTVar3 = imageTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar6 != 9; lVar6 = lVar6 + 1) {
      pTVar3 = (TestCaseGroup *)operator_new(0x70);
      getShaderImageFormatQualifier_abi_cxx11_
                ((string *)&stream,(sparse *)(createImageSparseResidencyTests::formats + lVar6),
                 format);
      tcu::TestCaseGroup::TestCaseGroup(pTVar3,local_260,_stream,"");
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = pTVar3;
      std::__cxx11::string::~string((string *)&stream);
      for (lVar7 = 4;
          pTVar3 = formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, lVar7 != 0x28; lVar7 = lVar7 + 0xc) {
        tcu::Vector<unsigned_int,_3>::Vector
                  (&imageSize,
                   (Vector<unsigned_int,_3> *)((long)local_248->imageSizes[0].m_data + lVar7 + -4));
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&stream);
        poVar4 = std::operator<<(poVar4,"_");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"_");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        pTVar3 = formatGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        node = (TestNode *)operator_new(0x90);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_261);
        TestCase::TestCase((TestCase *)node,local_260,&local_1e8,&local_1c8);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c07990;
        *(ImageType *)&node[1]._vptr_TestNode = IVar1;
        tcu::Vector<unsigned_int,_3>::Vector
                  ((Vector<unsigned_int,_3> *)((long)&node[1]._vptr_TestNode + 4),&imageSize);
        node[1].m_name._M_dataplus._M_p = (pointer)createImageSparseResidencyTests::formats[lVar6];
        *(undefined4 *)&node[1].m_name._M_string_length = 0xc;
        tcu::TestNode::addChild(&pTVar3->super_TestNode,node);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
      }
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(imageTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    }
    imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(testGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&imageTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    local_248 = local_248 + 1;
  }
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createImageSparseResidencyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_sparse_residency", "Buffer Sparse Residency"));

	static const deUint32 sizeCountPerImageType = 3u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_2D,		 { tcu::UVec3(512u, 256u, 1u),  tcu::UVec3(1024u, 128u, 1u), tcu::UVec3(11u,  137u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	 { tcu::UVec3(512u, 256u, 6u),	tcu::UVec3(1024u, 128u, 8u), tcu::UVec3(11u,  137u, 3u) } },
		{ IMAGE_TYPE_CUBE,		 { tcu::UVec3(256u, 256u, 1u),	tcu::UVec3(128u,  128u, 1u), tcu::UVec3(137u, 137u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY, { tcu::UVec3(256u, 256u, 6u),	tcu::UVec3(128u,  128u, 8u), tcu::UVec3(137u, 137u, 3u) } },
		{ IMAGE_TYPE_3D,		 { tcu::UVec3(512u, 256u, 16u), tcu::UVec3(1024u, 128u, 8u), tcu::UVec3(11u,  137u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RG,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RG,   tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RG,   tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8)
	};

	for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
	{
		const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
		de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(imageType).c_str(), ""));

		for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		{
			const tcu::TextureFormat&		format = formats[formatNdx];
			de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

			for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
			{
				const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

				std::ostringstream stream;
				stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

				formatGroup->addChild(new ImageSparseResidencyCase(testCtx, stream.str(), "", imageType, imageSize, format, glu::GLSL_VERSION_440));
			}
			imageTypeGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageTypeGroup.release());
	}

	return testGroup.release();
}